

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_buffer.cpp
# Opt level: O3

void __thiscall
duckdb::PartialBlockForIndex::Flush(PartialBlockForIndex *this,idx_t free_space_left)

{
  shared_ptr<duckdb::BlockHandle,_true> *old_block;
  BlockManager *block_id;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  PartialBlock::FlushInternal(&this->super_PartialBlock,free_space_left);
  old_block = (shared_ptr<duckdb::BlockHandle,_true> *)(this->super_PartialBlock).state.block_id;
  block_id = (this->super_PartialBlock).block_manager;
  local_18 = (this->super_PartialBlock).block_handle.internal.
             super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uStack_10 = (this->super_PartialBlock).block_handle.internal.
              super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->super_PartialBlock).block_handle.internal.
  super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PartialBlock).block_handle.internal.
  super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  BlockManager::ConvertToPersistent
            ((BlockManager *)&stack0xffffffffffffffd8,(block_id_t)block_id,old_block);
  p_Var2 = p_Stack_20;
  peVar1 = local_28;
  local_28 = (element_type *)0x0;
  p_Stack_20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->super_PartialBlock).block_handle.internal.
            super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->super_PartialBlock).block_handle.internal.
  super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->super_PartialBlock).block_handle.internal.
  super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (p_Stack_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_20);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uStack_10 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uStack_10);
  }
  (*(this->super_PartialBlock)._vptr_PartialBlock[4])(this);
  return;
}

Assistant:

void PartialBlockForIndex::Flush(const idx_t free_space_left) {
	FlushInternal(free_space_left);
	block_handle = block_manager.ConvertToPersistent(state.block_id, std::move(block_handle));
	Clear();
}